

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cell_index.cc
# Opt level: O0

void __thiscall S2CellIndex::Build(S2CellIndex *this)

{
  bool bVar1;
  size_type sVar2;
  S2CellId _start_id;
  S2CellId _cell_id;
  iterator __first;
  iterator __last;
  ulong uVar3;
  reference pvVar4;
  reference pvVar5;
  bool local_1d1;
  RangeNode local_15c;
  uint64 local_150;
  S2CellId local_148;
  S2CellId local_140;
  CellNode local_138;
  uint64 local_128;
  uint64 local_120;
  S2CellId local_118;
  S2CellId start_id;
  int i;
  int contents;
  Delta local_e4;
  uint64 local_d0;
  S2CellId local_c8;
  Delta local_c0;
  uint64 local_ac;
  S2CellId local_a4;
  S2CellId local_9c;
  Delta local_94;
  uint64 local_80;
  uint64 local_74;
  Delta local_6c;
  reference local_58;
  CellNode *node;
  iterator __end1;
  iterator __begin1;
  vector<S2CellIndex::CellNode,_std::allocator<S2CellIndex::CellNode>_> *__range1;
  undefined1 local_28 [8];
  vector<Delta,_std::allocator<Delta>_> deltas;
  S2CellIndex *this_local;
  
  deltas.super__Vector_base<Delta,_std::allocator<Delta>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)this;
  std::vector<Delta,_std::allocator<Delta>_>::vector
            ((vector<Delta,_std::allocator<Delta>_> *)local_28);
  sVar2 = std::vector<S2CellIndex::CellNode,_std::allocator<S2CellIndex::CellNode>_>::size
                    (&this->cell_tree_);
  std::vector<Delta,_std::allocator<Delta>_>::reserve
            ((vector<Delta,_std::allocator<Delta>_> *)local_28,sVar2 * 2 + 2);
  __end1 = std::vector<S2CellIndex::CellNode,_std::allocator<S2CellIndex::CellNode>_>::begin
                     (&this->cell_tree_);
  node = (CellNode *)
         std::vector<S2CellIndex::CellNode,_std::allocator<S2CellIndex::CellNode>_>::end
                   (&this->cell_tree_);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<S2CellIndex::CellNode_*,_std::vector<S2CellIndex::CellNode,_std::allocator<S2CellIndex::CellNode>_>_>
                                     *)&node), bVar1) {
    local_58 = __gnu_cxx::
               __normal_iterator<S2CellIndex::CellNode_*,_std::vector<S2CellIndex::CellNode,_std::allocator<S2CellIndex::CellNode>_>_>
               ::operator*(&__end1);
    local_74 = (uint64)S2CellId::range_min(&local_58->cell_id);
    local_80 = (local_58->cell_id).id_;
    Build::Delta::Delta(&local_6c,(S2CellId)local_74,(S2CellId)local_80,local_58->label);
    std::vector<Delta,_std::allocator<Delta>_>::push_back
              ((vector<Delta,_std::allocator<Delta>_> *)local_28,&local_6c);
    local_a4 = S2CellId::range_max(&local_58->cell_id);
    local_9c = S2CellId::next(&local_a4);
    local_ac = (uint64)S2CellId::Sentinel();
    Build::Delta::Delta(&local_94,local_9c,(S2CellId)local_ac,-1);
    std::vector<Delta,_std::allocator<Delta>_>::push_back
              ((vector<Delta,_std::allocator<Delta>_> *)local_28,&local_94);
    __gnu_cxx::
    __normal_iterator<S2CellIndex::CellNode_*,_std::vector<S2CellIndex::CellNode,_std::allocator<S2CellIndex::CellNode>_>_>
    ::operator++(&__end1);
  }
  local_c8 = S2CellId::Begin(0x1e);
  local_d0 = (uint64)S2CellId::None();
  Build::Delta::Delta(&local_c0,local_c8,(S2CellId)local_d0,-1);
  std::vector<Delta,_std::allocator<Delta>_>::push_back
            ((vector<Delta,_std::allocator<Delta>_> *)local_28,&local_c0);
  _start_id = S2CellId::End(0x1e);
  _cell_id = S2CellId::None();
  Build::Delta::Delta(&local_e4,_start_id,_cell_id,-1);
  std::vector<Delta,_std::allocator<Delta>_>::push_back
            ((vector<Delta,_std::allocator<Delta>_> *)local_28,&local_e4);
  __first = std::vector<Delta,_std::allocator<Delta>_>::begin
                      ((vector<Delta,_std::allocator<Delta>_> *)local_28);
  __last = std::vector<Delta,_std::allocator<Delta>_>::end
                     ((vector<Delta,_std::allocator<Delta>_> *)local_28);
  std::
  sort<__gnu_cxx::__normal_iterator<S2CellIndex::Build()::Delta*,std::vector<S2CellIndex::Build()::Delta,std::allocator<S2CellIndex::Build()::Delta>>>>
            ((__normal_iterator<Delta_*,_std::vector<Delta,_std::allocator<Delta>_>_>)
             __first._M_current,
             (__normal_iterator<Delta_*,_std::vector<Delta,_std::allocator<Delta>_>_>)
             __last._M_current);
  std::vector<S2CellIndex::CellNode,_std::allocator<S2CellIndex::CellNode>_>::clear
            (&this->cell_tree_);
  sVar2 = std::vector<Delta,_std::allocator<Delta>_>::size
                    ((vector<Delta,_std::allocator<Delta>_> *)local_28);
  std::vector<S2CellIndex::RangeNode,_std::allocator<S2CellIndex::RangeNode>_>::reserve
            (&this->range_nodes_,sVar2);
  start_id.id_._4_4_ = -1;
  start_id.id_._0_4_ = 0;
  while (uVar3 = (ulong)(int)start_id.id_,
        sVar2 = std::vector<Delta,_std::allocator<Delta>_>::size
                          ((vector<Delta,_std::allocator<Delta>_> *)local_28), uVar3 < sVar2) {
    pvVar4 = std::vector<Delta,_std::allocator<Delta>_>::operator[]
                       ((vector<Delta,_std::allocator<Delta>_> *)local_28,(long)(int)start_id.id_);
    local_118.id_ = (pvVar4->start_id).id_;
    while( true ) {
      uVar3 = (ulong)(int)start_id.id_;
      sVar2 = std::vector<Delta,_std::allocator<Delta>_>::size
                        ((vector<Delta,_std::allocator<Delta>_> *)local_28);
      local_1d1 = false;
      if (uVar3 < sVar2) {
        pvVar4 = std::vector<Delta,_std::allocator<Delta>_>::operator[]
                           ((vector<Delta,_std::allocator<Delta>_> *)local_28,
                            (long)(int)start_id.id_);
        local_120 = (pvVar4->start_id).id_;
        local_128 = local_118.id_;
        local_1d1 = ::operator==((S2CellId)local_120,local_118);
      }
      if (local_1d1 == false) break;
      pvVar4 = std::vector<Delta,_std::allocator<Delta>_>::operator[]
                         ((vector<Delta,_std::allocator<Delta>_> *)local_28,(long)(int)start_id.id_)
      ;
      if (pvVar4->label < 0) {
        pvVar4 = std::vector<Delta,_std::allocator<Delta>_>::operator[]
                           ((vector<Delta,_std::allocator<Delta>_> *)local_28,
                            (long)(int)start_id.id_);
        local_148.id_ = (pvVar4->cell_id).id_;
        local_150 = (uint64)S2CellId::Sentinel();
        bVar1 = ::operator==(local_148,(S2CellId)local_150);
        if (bVar1) {
          pvVar5 = std::vector<S2CellIndex::CellNode,_std::allocator<S2CellIndex::CellNode>_>::
                   operator[](&this->cell_tree_,(long)start_id.id_._4_4_);
          start_id.id_._4_4_ = pvVar5->parent;
        }
      }
      else {
        pvVar4 = std::vector<Delta,_std::allocator<Delta>_>::operator[]
                           ((vector<Delta,_std::allocator<Delta>_> *)local_28,
                            (long)(int)start_id.id_);
        local_140.id_ = (pvVar4->cell_id).id_;
        pvVar4 = std::vector<Delta,_std::allocator<Delta>_>::operator[]
                           ((vector<Delta,_std::allocator<Delta>_> *)local_28,
                            (long)(int)start_id.id_);
        CellNode::CellNode(&local_138,local_140,pvVar4->label,start_id.id_._4_4_);
        std::vector<S2CellIndex::CellNode,_std::allocator<S2CellIndex::CellNode>_>::push_back
                  (&this->cell_tree_,&local_138);
        sVar2 = std::vector<S2CellIndex::CellNode,_std::allocator<S2CellIndex::CellNode>_>::size
                          (&this->cell_tree_);
        start_id.id_._4_4_ = (int)sVar2 + -1;
      }
      start_id.id_._0_4_ = (int)start_id.id_ + 1;
    }
    RangeNode::RangeNode(&local_15c,local_118,start_id.id_._4_4_);
    std::vector<S2CellIndex::RangeNode,_std::allocator<S2CellIndex::RangeNode>_>::push_back
              (&this->range_nodes_,&local_15c);
  }
  std::vector<Delta,_std::allocator<Delta>_>::~vector
            ((vector<Delta,_std::allocator<Delta>_> *)local_28);
  return;
}

Assistant:

void S2CellIndex::Build() {
  // To build the cell tree and leaf cell ranges, we maintain a stack of
  // (cell_id, label) pairs that contain the current leaf cell.  This class
  // represents an instruction to push or pop a (cell_id, label) pair.
  //
  // If label >= 0, the (cell_id, label) pair is pushed on the stack.
  // If cell_id == S2CellId::Sentinel(), a pair is popped from the stack.
  // Otherwise the stack is unchanged but a RangeNode is still emitted.
  struct Delta {
    S2CellId start_id, cell_id;
    Label label;

    Delta(S2CellId _start_id, S2CellId _cell_id, Label _label)
        : start_id(_start_id), cell_id(_cell_id), label(_label) {}

    // Deltas are sorted first by start_id, then in reverse order by cell_id,
    // and then by label.  This is necessary to ensure that (1) larger cells
    // are pushed on the stack before smaller cells, and (2) cells are popped
    // off the stack before any new cells are added.
    bool operator<(const Delta& y) const {
      if (start_id < y.start_id) return true;
      if (y.start_id < start_id) return false;
      if (y.cell_id < cell_id) return true;
      if (cell_id < y.cell_id) return false;
      return label < y.label;
    }
  };

  vector<Delta> deltas;
  deltas.reserve(2 * cell_tree_.size() + 2);
  // Create two deltas for each (cell_id, label) pair: one to add the pair to
  // the stack (at the start of its leaf cell range), and one to remove it from
  // the stack (at the end of its leaf cell range).
  for (const CellNode& node : cell_tree_) {
    deltas.push_back(Delta(node.cell_id.range_min(), node.cell_id, node.label));
    deltas.push_back(Delta(node.cell_id.range_max().next(),
                           S2CellId::Sentinel(), -1));
  }
  // We also create two special deltas to ensure that a RangeNode is emitted at
  // the beginning and end of the S2CellId range.
  deltas.push_back(
      Delta(S2CellId::Begin(S2CellId::kMaxLevel), S2CellId::None(), -1));
  deltas.push_back(
      Delta(S2CellId::End(S2CellId::kMaxLevel), S2CellId::None(), -1));
  std::sort(deltas.begin(), deltas.end());

  // Now walk through the deltas to build the leaf cell ranges and cell tree
  // (which is essentially a permanent form of the "stack" described above).
  cell_tree_.clear();
  range_nodes_.reserve(deltas.size());
  int contents = -1;
  for (int i = 0; i < deltas.size(); ) {
    S2CellId start_id = deltas[i].start_id;
    // Process all the deltas associated with the current start_id.
    for (; i < deltas.size() && deltas[i].start_id == start_id; ++i) {
      if (deltas[i].label >= 0) {
        cell_tree_.push_back({deltas[i].cell_id, deltas[i].label, contents});
        contents = cell_tree_.size() - 1;
      } else if (deltas[i].cell_id == S2CellId::Sentinel()) {
        contents = cell_tree_[contents].parent;
      }
    }
    range_nodes_.push_back({start_id, contents});
  }
}